

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

BigInteger * __thiscall rapidjson::internal::BigInteger::operator*=(BigInteger *this,uint64_t u)

{
  uint64_t in_RAX;
  ulong uVar1;
  uint64_t uVar2;
  size_t i;
  ulong uVar3;
  uint64_t hi;
  uint64_t local_28;
  
  if (u != 1) {
    if (u == 0) {
      this->digits_[0] = 0;
    }
    else {
      uVar1 = this->count_;
      if ((uVar1 != 1) || (this->digits_[0] != 1)) {
        uVar2 = 0;
        local_28 = in_RAX;
        for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
          uVar2 = MulAdd64(this->digits_[uVar3],u,uVar2,&local_28);
          this->digits_[uVar3] = uVar2;
          uVar1 = this->count_;
          uVar2 = local_28;
        }
        if (uVar2 == 0) {
          return this;
        }
        PushBack(this,uVar2);
        return this;
      }
      this->digits_[0] = u;
    }
    this->count_ = 1;
  }
  return this;
}

Assistant:

BigInteger& operator*=(uint64_t u) {
        if (u == 0) return *this = 0;
        if (u == 1) return *this;
        if (*this == 1) return *this = u;

        uint64_t k = 0;
        for (size_t i = 0; i < count_; i++) {
            uint64_t hi;
            digits_[i] = MulAdd64(digits_[i], u, k, &hi);
            k = hi;
        }
        
        if (k > 0)
            PushBack(k);

        return *this;
    }